

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O2

int POSIX::multithreading::Pthread_create
              (pthread_t *thread,pthread_attr_t *attr,_func_void_ptr_void_ptr *start_routine,
              void *arg)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  iVar1 = pthread_create(thread,(pthread_attr_t *)attr,(__start_routine *)start_routine,arg);
  std::__cxx11::string::string((string *)&local_30,"pthrad_create error",&local_31);
  iVar1 = check_error(iVar1,&local_30,0);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int Pthread_create(pthread_t *thread, const pthread_attr_t *attr, void *(*start_routine) (void *), void *arg) {
            return check_error(pthread_create(thread, attr, start_routine, arg), "pthrad_create error");
        }